

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O2

void KosinskiDecompress(KosinskiDecompressCallbacks *callbacks,cc_bool print_debug_information)

{
  cc_bool cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  char *__format;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  read_position = 0;
  write_position = 0;
  GetDescriptor(callbacks);
  do {
    while( true ) {
      while (cVar1 = PopDescriptor(callbacks), sVar5 = read_position, cVar1 != '\0') {
        read_position = read_position + 1;
        uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
        if (print_debug_information == '\0') {
          uVar4 = uVar3 & 0xff;
        }
        else {
          uVar4 = (uint)((ulong)uVar3 & 0xff);
          fprintf(_stderr,"%lX - Literal match: At %lX, value %X\n",sVar5,write_position,
                  (ulong)uVar3 & 0xff);
        }
        WriteByte(uVar4,callbacks);
      }
      cVar1 = PopDescriptor(callbacks);
      sVar5 = read_position;
      if (cVar1 != '\0') break;
      cVar1 = PopDescriptor(callbacks);
      bVar2 = PopDescriptor(callbacks);
      read_position = read_position + 1;
      uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      uVar3 = (uVar3 ^ 0xff) + 1;
      uVar8 = (ulong)bVar2 + (ulong)(cVar1 != '\0') * 2 + 2;
      if (print_debug_information != '\0') {
        sVar5 = read_position - 1;
        lVar7 = write_position - uVar3;
        __format = "%lX - Inline match: At %lX, src %lX, len %lX\n";
LAB_0010149b:
        fprintf(_stderr,__format,sVar5,write_position,lVar7,uVar8);
      }
LAB_001014a8:
      while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
        WriteByte((uint)backsearch_buffer[(int)write_position - uVar3 & 0x1fff],callbacks);
      }
    }
    read_position = read_position + 1;
    uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    read_position = read_position + 1;
    uVar4 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    uVar3 = 0x2000 - (uVar3 & 0xff | (uVar4 & 0xf8) << 5);
    uVar6 = (ulong)uVar3;
    if ((uVar4 & 7) != 0) {
      uVar8 = (ulong)((uVar4 & 7) + 2);
      if (print_debug_information != '\0') {
        lVar7 = write_position - uVar6;
        __format = "%lX - Full match: At %lX, src %lX, len %lX\n";
        goto LAB_0010149b;
      }
      goto LAB_001014a8;
    }
    read_position = read_position + 1;
    uVar4 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    if (uVar4 == 0) {
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Terminator: At %lX, src %lX\n",sVar5,write_position,
                write_position - uVar6);
        return;
      }
      return;
    }
    uVar8 = (ulong)(uVar4 + 1);
    if (uVar4 + 1 != 2) {
      if (print_debug_information != '\0') {
        lVar7 = write_position - uVar6;
        __format = "%lX - Extended full match: At %lX, src %lX, len %lX\n";
        goto LAB_0010149b;
      }
      goto LAB_001014a8;
    }
    if (print_debug_information != '\0') {
      fprintf(_stderr,"%lX - 0xA000 boundary flag: At %lX, src %lX\n",sVar5,write_position,
              write_position - uVar6);
    }
  } while( true );
}

Assistant:

void KosinskiDecompress(const KosinskiDecompressCallbacks* const callbacks, const cc_bool print_debug_information)
{
	read_position = 0;
	write_position = 0;

	GetDescriptor(callbacks);

	for (;;)
	{
		if (PopDescriptor(callbacks))
		{
			const size_t position = read_position;

			const unsigned char byte = ReadByte(callbacks);

			if (print_debug_information)
				fprintf(stderr, "%lX - Literal match: At %lX, value %X\n", (unsigned long)position, (unsigned long)write_position, byte);

			WriteByte(byte, callbacks);
		}
		else
		{
			unsigned int distance;
			size_t count;

			if (PopDescriptor(callbacks))
			{
				const size_t position = read_position;

				const unsigned char low_byte = ReadByte(callbacks);
				const unsigned char high_byte = ReadByte(callbacks);

				distance = ((high_byte & 0xF8) << 5) | low_byte;
				distance = (distance ^ 0x1FFF) + 1; /* Convert from negative two's-complement to positive */
				count = high_byte & 7;

				if (count != 0)
				{
					count += 2;

					if (print_debug_information)
						fprintf(stderr, "%lX - Full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
				}
				else
				{
					count = ReadByte(callbacks) + 1;

					if (count == 1)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Terminator: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						break;
					}
					else if (count == 2)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - 0xA000 boundary flag: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						continue;
					}
					else
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Extended full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
					}
				}
			}
			else
			{
				count = 2;

				if (PopDescriptor(callbacks))
					count += 2;
				if (PopDescriptor(callbacks))
					count += 1;

				distance = (ReadByte(callbacks) ^ 0xFF) + 1; /* Convert from negative two's-complement to positive */

				if (print_debug_information)
					fprintf(stderr, "%lX - Inline match: At %lX, src %lX, len %lX\n", (unsigned long)(read_position - 1), (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
			}

			while (count-- != 0)
				WriteByte(backsearch_buffer[(write_position - distance) % SLIDING_WINDOW_SIZE], callbacks);
		}
	}
}